

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void mbedtls_mpi_core_exp_mod_optionally_safe
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *N,size_t AN_limbs,
               mbedtls_mpi_uint *E,size_t E_limbs,int E_public,mbedtls_mpi_uint *RR,
               mbedtls_mpi_uint *T)

{
  mbedtls_mpi_uint *T_00;
  mbedtls_mpi_uint *A_00;
  mbedtls_mpi_uint *pmVar1;
  mbedtls_mpi_uint *RR_00;
  mbedtls_mpi_uint *N_00;
  mbedtls_mpi_uint *in_RCX;
  mbedtls_mpi_uint *in_RDX;
  void *in_RDI;
  long in_R8;
  mbedtls_mpi_uint window;
  size_t window_bits;
  mbedtls_mpi_uint mm;
  mbedtls_mpi_uint *temp;
  mbedtls_mpi_uint *Wselect;
  mbedtls_mpi_uint *Wtable;
  size_t select_limbs;
  size_t table_limbs;
  size_t welem;
  size_t wsize;
  size_t E_bit_index;
  size_t E_limb_index;
  size_t *in_stack_ffffffffffffff60;
  mbedtls_mpi_uint *welem_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined8 in_stack_ffffffffffffff70;
  ulong AN_limbs_00;
  size_t in_stack_ffffffffffffff78;
  mbedtls_mpi_uint *in_stack_ffffffffffffff80;
  mbedtls_mpi_uint *Wselect_00;
  mbedtls_mpi_uint *B_limbs;
  mbedtls_mpi_uint *X_00;
  mbedtls_mpi_uint *in_stack_ffffffffffffffc0;
  mbedtls_mpi_uint *in_stack_ffffffffffffffc8;
  
  exp_mod_calc_first_bit_optionally_safe
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (size_t *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  T_00 = (mbedtls_mpi_uint *)exp_mod_get_window_size((long)in_stack_ffffffffffffffc8 << 6);
  A_00 = (mbedtls_mpi_uint *)(1L << ((byte)T_00 & 0x3f));
  pmVar1 = (mbedtls_mpi_uint *)((long)A_00 * (long)in_RCX);
  RR_00 = (mbedtls_mpi_uint *)(window + (long)pmVar1 * 8);
  welem_00 = RR_00 + (long)in_RCX;
  X_00 = in_RCX;
  N_00 = (mbedtls_mpi_uint *)mbedtls_mpi_core_montmul_init(in_RDX);
  exp_mod_precompute_window
            (A_00,pmVar1,(size_t)X_00,window,RR_00,(size_t)welem_00,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  memcpy(in_RDI,(void *)window,(long)in_RCX << 3);
  pmVar1 = (mbedtls_mpi_uint *)0x0;
  AN_limbs_00 = 0;
  do {
    Wselect_00 = N_00;
    B_limbs = welem_00;
    mbedtls_mpi_core_montmul
              (X_00,(mbedtls_mpi_uint *)window,RR_00,(size_t)welem_00,N_00,(size_t)pmVar1,
               (mbedtls_mpi_uint)A_00,T_00);
    if (in_stack_ffffffffffffffc0 == (mbedtls_mpi_uint *)0x0) {
      in_stack_ffffffffffffffc8 = (mbedtls_mpi_uint *)((long)in_stack_ffffffffffffffc8 + -1);
      in_stack_ffffffffffffffc0 = (mbedtls_mpi_uint *)0x3f;
    }
    else {
      in_stack_ffffffffffffffc0 = (mbedtls_mpi_uint *)((long)in_stack_ffffffffffffffc0 + -1);
    }
    pmVar1 = (mbedtls_mpi_uint *)((long)pmVar1 + 1);
    AN_limbs_00 = *(ulong *)(in_R8 + (long)in_stack_ffffffffffffffc8 * 8) >>
                  ((byte)in_stack_ffffffffffffffc0 & 0x3f) & 1 | AN_limbs_00 << 1;
    if ((pmVar1 == T_00) ||
       ((in_stack_ffffffffffffffc0 == (mbedtls_mpi_uint *)0x0 &&
        (in_stack_ffffffffffffffc8 == (mbedtls_mpi_uint *)0x0)))) {
      exp_mod_table_lookup_optionally_safe
                (Wselect_00,pmVar1,AN_limbs_00,
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 (mbedtls_mpi_uint)welem_00,(int)((ulong)N_00 >> 0x20));
      mbedtls_mpi_core_montmul
                (X_00,(mbedtls_mpi_uint *)window,RR_00,(size_t)B_limbs,Wselect_00,(size_t)pmVar1,
                 (mbedtls_mpi_uint)A_00,T_00);
      AN_limbs_00 = 0;
      pmVar1 = (mbedtls_mpi_uint *)0x0;
    }
    in_stack_ffffffffffffff6f =
         in_stack_ffffffffffffffc0 == (mbedtls_mpi_uint *)0x0 &&
         in_stack_ffffffffffffffc8 == (mbedtls_mpi_uint *)0x0;
    N_00 = Wselect_00;
    welem_00 = B_limbs;
  } while (in_stack_ffffffffffffffc0 != (mbedtls_mpi_uint *)0x0 ||
           in_stack_ffffffffffffffc8 != (mbedtls_mpi_uint *)0x0);
  return;
}

Assistant:

static void mbedtls_mpi_core_exp_mod_optionally_safe(mbedtls_mpi_uint *X,
                                                     const mbedtls_mpi_uint *A,
                                                     const mbedtls_mpi_uint *N,
                                                     size_t AN_limbs,
                                                     const mbedtls_mpi_uint *E,
                                                     size_t E_limbs,
                                                     int E_public,
                                                     const mbedtls_mpi_uint *RR,
                                                     mbedtls_mpi_uint *T)
{
    /* We'll process the bits of E from most significant
     * (limb_index=E_limbs-1, E_bit_index=biL-1) to least significant
     * (limb_index=0, E_bit_index=0). */
    size_t E_limb_index;
    size_t E_bit_index;
    exp_mod_calc_first_bit_optionally_safe(E, E_limbs, E_public,
                                           &E_limb_index, &E_bit_index);

    const size_t wsize = exp_mod_get_window_size(E_limb_index * biL);
    const size_t welem = ((size_t) 1) << wsize;

    /* This is how we will use the temporary storage T, which must have space
     * for table_limbs, select_limbs and (2 * AN_limbs + 1) for montmul. */
    const size_t table_limbs  = welem * AN_limbs;
    const size_t select_limbs = AN_limbs;

    /* Pointers to specific parts of the temporary working memory pool */
    mbedtls_mpi_uint *const Wtable  = T;
    mbedtls_mpi_uint *const Wselect = Wtable  +  table_limbs;
    mbedtls_mpi_uint *const temp    = Wselect + select_limbs;

    /*
     * Window precomputation
     */

    const mbedtls_mpi_uint mm = mbedtls_mpi_core_montmul_init(N);

    /* Set Wtable[i] = A^i (in Montgomery representation) */
    exp_mod_precompute_window(A, N, AN_limbs,
                              mm, RR,
                              welem, Wtable, temp);

    /*
     * Fixed window exponentiation
     */

    /* X = 1 (in Montgomery presentation) initially */
    memcpy(X, Wtable, AN_limbs * ciL);

    /* At any given time, window contains window_bits bits from E.
     * window_bits can go up to wsize. */
    size_t window_bits = 0;
    mbedtls_mpi_uint window = 0;

    do {
        /* Square */
        mbedtls_mpi_core_montmul(X, X, X, AN_limbs, N, AN_limbs, mm, temp);

        /* Move to the next bit of the exponent */
        if (E_bit_index == 0) {
            --E_limb_index;
            E_bit_index = biL - 1;
        } else {
            --E_bit_index;
        }
        /* Insert next exponent bit into window */
        ++window_bits;
        window <<= 1;
        window |= (E[E_limb_index] >> E_bit_index) & 1;

        /* Clear window if it's full. Also clear the window at the end,
         * when we've finished processing the exponent. */
        if (window_bits == wsize ||
            (E_bit_index == 0 && E_limb_index == 0)) {

            exp_mod_table_lookup_optionally_safe(Wselect, Wtable, AN_limbs, welem,
                                                 window, E_public);
            /* Multiply X by the selected element. */
            mbedtls_mpi_core_montmul(X, X, Wselect, AN_limbs, N, AN_limbs, mm,
                                     temp);
            window = 0;
            window_bits = 0;
        }
    } while (!(E_bit_index == 0 && E_limb_index == 0));
}